

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O3

string * replaceGlobal(string *__return_storage_ptr__,string *targetString,string *oldValue,
                      string *newValue)

{
  long lVar1;
  string preOld;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  lVar1 = std::__cxx11::string::find((char *)targetString,(ulong)(oldValue->_M_dataplus)._M_p,0);
  if (lVar1 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)targetString);
      std::operator+(&local_50,&local_78,newValue);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar1 = std::__cxx11::string::find
                        ((char *)targetString,(ulong)(oldValue->_M_dataplus)._M_p,
                         (long)((int)lVar1 + (int)oldValue->_M_string_length));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    } while (lVar1 != -1);
  }
  std::__cxx11::string::substr((ulong)&local_78,(ulong)targetString);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string replaceGlobal( string targetString, string oldValue, string newValue ) {
    int pos = 0;
    string resultString = "";
    size_t targetPos = targetString.find( oldValue, pos );
    while( targetPos != string::npos ) {
        string preOld = targetString.substr( pos, targetPos - pos );
        resultString += preOld + newValue;
        pos = targetPos + oldValue.length();
        targetPos = targetString.find( oldValue, pos );
    }
    resultString += targetString.substr(pos);
    return resultString;
}